

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O2

void __thiscall
slang::ast::PatternCaseStatement::visitStmts<hgdb::rtl::Serializer&>
          (PatternCaseStatement *this,Serializer *visitor)

{
  Statement *this_00;
  long lVar1;
  ItemGroup *item;
  pointer pIVar2;
  
  pIVar2 = (this->items).data_;
  for (lVar1 = (this->items).size_ * 0x18; lVar1 != 0; lVar1 = lVar1 + -0x18) {
    this_00 = not_null<const_slang::ast::Statement_*>::get(&pIVar2->stmt);
    Statement::visit<hgdb::rtl::Serializer&>(this_00,visitor);
    pIVar2 = pIVar2 + 1;
  }
  if (this->defaultCase != (Statement *)0x0) {
    Statement::visit<hgdb::rtl::Serializer&>(this->defaultCase,visitor);
    return;
  }
  return;
}

Assistant:

void visitStmts(TVisitor&& visitor) const {
        for (auto& item : items)
            item.stmt->visit(visitor);
        if (defaultCase)
            defaultCase->visit(visitor);
    }